

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPile.cpp
# Opt level: O0

void __thiscall
solitaire::piles::StockPile::Snapshot::Snapshot
          (Snapshot *this,shared_ptr<solitaire::piles::StockPile> *stockPile,Cards *pileCards,
          optional<unsigned_int> selectedCardIndex)

{
  Cards *pileCards_local;
  shared_ptr<solitaire::piles::StockPile> *stockPile_local;
  Snapshot *this_local;
  optional<unsigned_int> selectedCardIndex_local;
  
  archivers::interfaces::Snapshot::Snapshot(&this->super_Snapshot);
  (this->super_Snapshot)._vptr_Snapshot = (_func_int **)&PTR__Snapshot_0050c708;
  std::shared_ptr<solitaire::piles::StockPile>::shared_ptr(&this->stockPile,stockPile);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&this->pileCards,pileCards);
  (this->selectedCardIndex).super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_payload_base<unsigned_int>)
       selectedCardIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>;
  return;
}

Assistant:

StockPile::Snapshot::Snapshot(
    std::shared_ptr<StockPile> stockPile, Cards pileCards,
    std::optional<unsigned> selectedCardIndex):
    stockPile {std::move(stockPile)},
    pileCards {std::move(pileCards)},
    selectedCardIndex {std::move(selectedCardIndex)} {
}